

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_2x2_pack8.h
# Opt level: O3

void ncnn::conv2x2s1_pack8_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 (*pauVar13) [32];
  undefined1 (*pauVar14) [32];
  undefined4 *puVar15;
  undefined4 *puVar16;
  int iVar17;
  ulong uVar18;
  undefined4 *puVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 local_58 [32];
  
  iVar2 = top_blob->c;
  if (0 < (long)iVar2) {
    uVar3 = top_blob->w;
    iVar4 = top_blob->h;
    uVar5 = bottom_blob->c;
    lVar22 = 0;
    do {
      uVar18 = (long)top_blob->h * (long)top_blob->w;
      uVar12 = top_blob->elemsize;
      uVar11 = (uVar12 * uVar18 + 0xf & 0xfffffffffffffff0) / uVar12;
      if (top_blob->dims == 4) {
        uVar11 = uVar18;
      }
      if (_bias == (Mat *)0x0) {
        auVar24 = ZEXT1632(ZEXT816(0) << 0x40);
      }
      else {
        auVar24 = *(undefined1 (*) [32])(&_bias->data + lVar22 * 4);
      }
      pauVar13 = (undefined1 (*) [32])(top_blob->cstep * lVar22 * uVar12 + (long)top_blob->data);
      iVar10 = (int)uVar11 * top_blob->d;
      pauVar14 = pauVar13;
      if (0 < iVar10) {
        do {
          *pauVar14 = auVar24;
          pauVar14 = pauVar14 + 1;
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      if (0 < (int)uVar5) {
        uVar12 = 0;
        do {
          if (0 < iVar4) {
            lVar21 = kernel->cstep * lVar22 * kernel->elemsize;
            pvVar6 = kernel->data;
            lVar23 = (long)kernel->w * uVar12 * kernel->elemsize;
            puVar15 = (undefined4 *)
                      (bottom_blob->cstep * uVar12 * bottom_blob->elemsize + (long)bottom_blob->data
                      );
            puVar19 = (undefined4 *)((long)bottom_blob->w * bottom_blob->elemsize + (long)puVar15);
            iVar10 = 0;
            pauVar14 = pauVar13;
            do {
              if ((int)uVar3 < 2) {
                uVar20 = 0;
              }
              else {
                iVar17 = 1;
                do {
                  uVar1 = *puVar15;
                  auVar29._4_4_ = uVar1;
                  auVar29._0_4_ = uVar1;
                  auVar29._8_4_ = uVar1;
                  auVar29._12_4_ = uVar1;
                  auVar29._16_4_ = uVar1;
                  auVar29._20_4_ = uVar1;
                  auVar29._24_4_ = uVar1;
                  auVar29._28_4_ = uVar1;
                  uVar1 = puVar15[1];
                  auVar33._4_4_ = uVar1;
                  auVar33._0_4_ = uVar1;
                  auVar33._8_4_ = uVar1;
                  auVar33._12_4_ = uVar1;
                  auVar33._16_4_ = uVar1;
                  auVar33._20_4_ = uVar1;
                  auVar33._24_4_ = uVar1;
                  auVar33._28_4_ = uVar1;
                  uVar1 = puVar15[2];
                  auVar53._4_4_ = uVar1;
                  auVar53._0_4_ = uVar1;
                  auVar53._8_4_ = uVar1;
                  auVar53._12_4_ = uVar1;
                  auVar53._16_4_ = uVar1;
                  auVar53._20_4_ = uVar1;
                  auVar53._24_4_ = uVar1;
                  auVar53._28_4_ = uVar1;
                  uVar1 = puVar15[3];
                  auVar75._4_4_ = uVar1;
                  auVar75._0_4_ = uVar1;
                  auVar75._8_4_ = uVar1;
                  auVar75._12_4_ = uVar1;
                  auVar75._16_4_ = uVar1;
                  auVar75._20_4_ = uVar1;
                  auVar75._24_4_ = uVar1;
                  auVar75._28_4_ = uVar1;
                  uVar1 = puVar15[4];
                  auVar82._4_4_ = uVar1;
                  auVar82._0_4_ = uVar1;
                  auVar82._8_4_ = uVar1;
                  auVar82._12_4_ = uVar1;
                  auVar82._16_4_ = uVar1;
                  auVar82._20_4_ = uVar1;
                  auVar82._24_4_ = uVar1;
                  auVar82._28_4_ = uVar1;
                  uVar1 = puVar15[5];
                  auVar92._4_4_ = uVar1;
                  auVar92._0_4_ = uVar1;
                  auVar92._8_4_ = uVar1;
                  auVar92._12_4_ = uVar1;
                  auVar92._16_4_ = uVar1;
                  auVar92._20_4_ = uVar1;
                  auVar92._24_4_ = uVar1;
                  auVar92._28_4_ = uVar1;
                  uVar1 = puVar15[6];
                  auVar94._4_4_ = uVar1;
                  auVar94._0_4_ = uVar1;
                  auVar94._8_4_ = uVar1;
                  auVar94._12_4_ = uVar1;
                  auVar94._16_4_ = uVar1;
                  auVar94._20_4_ = uVar1;
                  auVar94._24_4_ = uVar1;
                  auVar94._28_4_ = uVar1;
                  uVar1 = puVar15[7];
                  auVar67._4_4_ = uVar1;
                  auVar67._0_4_ = uVar1;
                  auVar67._8_4_ = uVar1;
                  auVar67._12_4_ = uVar1;
                  auVar67._16_4_ = uVar1;
                  auVar67._20_4_ = uVar1;
                  auVar67._24_4_ = uVar1;
                  auVar67._28_4_ = uVar1;
                  auVar24 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21);
                  auVar36 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21 + 0x20);
                  auVar37 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21 + 0x40);
                  auVar38 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21 + 0x60);
                  auVar7 = vfmadd213ps_fma(auVar29,auVar24,*pauVar14);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar36,auVar33);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar37,auVar53);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar38,auVar75);
                  auVar25 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21 + 0x80);
                  auVar29 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21 + 0xa0);
                  auVar33 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21 + 0xc0);
                  auVar39 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21 + 0xe0);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar25,auVar82);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar29,auVar92);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar33,auVar94);
                  uVar1 = puVar15[8];
                  auVar47._4_4_ = uVar1;
                  auVar47._0_4_ = uVar1;
                  auVar47._8_4_ = uVar1;
                  auVar47._12_4_ = uVar1;
                  auVar47._16_4_ = uVar1;
                  auVar47._20_4_ = uVar1;
                  auVar47._24_4_ = uVar1;
                  auVar47._28_4_ = uVar1;
                  uVar1 = puVar15[9];
                  auVar99._4_4_ = uVar1;
                  auVar99._0_4_ = uVar1;
                  auVar99._8_4_ = uVar1;
                  auVar99._12_4_ = uVar1;
                  auVar99._16_4_ = uVar1;
                  auVar99._20_4_ = uVar1;
                  auVar99._24_4_ = uVar1;
                  auVar99._28_4_ = uVar1;
                  uVar1 = puVar15[10];
                  auVar93._4_4_ = uVar1;
                  auVar93._0_4_ = uVar1;
                  auVar93._8_4_ = uVar1;
                  auVar93._12_4_ = uVar1;
                  auVar93._16_4_ = uVar1;
                  auVar93._20_4_ = uVar1;
                  auVar93._24_4_ = uVar1;
                  auVar93._28_4_ = uVar1;
                  uVar1 = puVar15[0xb];
                  auVar83._4_4_ = uVar1;
                  auVar83._0_4_ = uVar1;
                  auVar83._8_4_ = uVar1;
                  auVar83._12_4_ = uVar1;
                  auVar83._16_4_ = uVar1;
                  auVar83._20_4_ = uVar1;
                  auVar83._24_4_ = uVar1;
                  auVar83._28_4_ = uVar1;
                  uVar1 = puVar15[0xc];
                  auVar54._4_4_ = uVar1;
                  auVar54._0_4_ = uVar1;
                  auVar54._8_4_ = uVar1;
                  auVar54._12_4_ = uVar1;
                  auVar54._16_4_ = uVar1;
                  auVar54._20_4_ = uVar1;
                  auVar54._24_4_ = uVar1;
                  auVar54._28_4_ = uVar1;
                  uVar1 = puVar15[0xd];
                  auVar34._4_4_ = uVar1;
                  auVar34._0_4_ = uVar1;
                  auVar34._8_4_ = uVar1;
                  auVar34._12_4_ = uVar1;
                  auVar34._16_4_ = uVar1;
                  auVar34._20_4_ = uVar1;
                  auVar34._24_4_ = uVar1;
                  auVar34._28_4_ = uVar1;
                  auVar7 = vfmadd213ps_fma(auVar24,auVar47,pauVar14[1]);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar39,auVar67);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar99,auVar36);
                  uVar1 = puVar15[0xe];
                  auVar95._4_4_ = uVar1;
                  auVar95._0_4_ = uVar1;
                  auVar95._8_4_ = uVar1;
                  auVar95._12_4_ = uVar1;
                  auVar95._16_4_ = uVar1;
                  auVar95._20_4_ = uVar1;
                  auVar95._24_4_ = uVar1;
                  auVar95._28_4_ = uVar1;
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar93,auVar37);
                  uVar1 = puVar15[0xf];
                  auVar68._4_4_ = uVar1;
                  auVar68._0_4_ = uVar1;
                  auVar68._8_4_ = uVar1;
                  auVar68._12_4_ = uVar1;
                  auVar68._16_4_ = uVar1;
                  auVar68._20_4_ = uVar1;
                  auVar68._24_4_ = uVar1;
                  auVar68._28_4_ = uVar1;
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar83,auVar38);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar54,auVar25);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar34,auVar29);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar95,auVar33);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar68,auVar39);
                  auVar24 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21 + 0x100);
                  auVar36 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21 + 0x120);
                  auVar37 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21 + 0x140);
                  auVar38 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21 + 0x160);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar24,auVar47);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar36,auVar99);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar37,auVar93);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar38,auVar83);
                  auVar25 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21 + 0x180);
                  auVar29 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21 + 0x1a0);
                  auVar33 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21 + 0x1c0);
                  auVar39 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21 + 0x1e0);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar25,auVar54);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar29,auVar34);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar33,auVar95);
                  uVar1 = puVar15[0x10];
                  auVar35._4_4_ = uVar1;
                  auVar35._0_4_ = uVar1;
                  auVar35._8_4_ = uVar1;
                  auVar35._12_4_ = uVar1;
                  auVar35._16_4_ = uVar1;
                  auVar35._20_4_ = uVar1;
                  auVar35._24_4_ = uVar1;
                  auVar35._28_4_ = uVar1;
                  uVar1 = puVar15[0x11];
                  auVar55._4_4_ = uVar1;
                  auVar55._0_4_ = uVar1;
                  auVar55._8_4_ = uVar1;
                  auVar55._12_4_ = uVar1;
                  auVar55._16_4_ = uVar1;
                  auVar55._20_4_ = uVar1;
                  auVar55._24_4_ = uVar1;
                  auVar55._28_4_ = uVar1;
                  uVar1 = puVar15[0x12];
                  auVar96._4_4_ = uVar1;
                  auVar96._0_4_ = uVar1;
                  auVar96._8_4_ = uVar1;
                  auVar96._12_4_ = uVar1;
                  auVar96._16_4_ = uVar1;
                  auVar96._20_4_ = uVar1;
                  auVar96._24_4_ = uVar1;
                  auVar96._28_4_ = uVar1;
                  uVar1 = puVar15[0x13];
                  auVar100._4_4_ = uVar1;
                  auVar100._0_4_ = uVar1;
                  auVar100._8_4_ = uVar1;
                  auVar100._12_4_ = uVar1;
                  auVar100._16_4_ = uVar1;
                  auVar100._20_4_ = uVar1;
                  auVar100._24_4_ = uVar1;
                  auVar100._28_4_ = uVar1;
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar39,auVar68);
                  uVar1 = puVar15[0x14];
                  auVar69._4_4_ = uVar1;
                  auVar69._0_4_ = uVar1;
                  auVar69._8_4_ = uVar1;
                  auVar69._12_4_ = uVar1;
                  auVar69._16_4_ = uVar1;
                  auVar69._20_4_ = uVar1;
                  auVar69._24_4_ = uVar1;
                  auVar69._28_4_ = uVar1;
                  auVar7 = vfmadd213ps_fma(auVar35,auVar24,ZEXT1632(auVar7));
                  uVar1 = puVar15[0x15];
                  auVar24._4_4_ = uVar1;
                  auVar24._0_4_ = uVar1;
                  auVar24._8_4_ = uVar1;
                  auVar24._12_4_ = uVar1;
                  auVar24._16_4_ = uVar1;
                  auVar24._20_4_ = uVar1;
                  auVar24._24_4_ = uVar1;
                  auVar24._28_4_ = uVar1;
                  uVar1 = puVar15[0x16];
                  auVar90._4_4_ = uVar1;
                  auVar90._0_4_ = uVar1;
                  auVar90._8_4_ = uVar1;
                  auVar90._12_4_ = uVar1;
                  auVar90._16_4_ = uVar1;
                  auVar90._20_4_ = uVar1;
                  auVar90._24_4_ = uVar1;
                  auVar90._28_4_ = uVar1;
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar36,auVar55);
                  uVar1 = puVar15[0x17];
                  auVar56._4_4_ = uVar1;
                  auVar56._0_4_ = uVar1;
                  auVar56._8_4_ = uVar1;
                  auVar56._12_4_ = uVar1;
                  auVar56._16_4_ = uVar1;
                  auVar56._20_4_ = uVar1;
                  auVar56._24_4_ = uVar1;
                  auVar56._28_4_ = uVar1;
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar37,auVar96);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar38,auVar100);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar25,auVar69);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar29,auVar24);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar33,auVar90);
                  uVar1 = *puVar19;
                  auVar25._4_4_ = uVar1;
                  auVar25._0_4_ = uVar1;
                  auVar25._8_4_ = uVar1;
                  auVar25._12_4_ = uVar1;
                  auVar25._16_4_ = uVar1;
                  auVar25._20_4_ = uVar1;
                  auVar25._24_4_ = uVar1;
                  auVar25._28_4_ = uVar1;
                  uVar1 = puVar19[1];
                  auVar76._4_4_ = uVar1;
                  auVar76._0_4_ = uVar1;
                  auVar76._8_4_ = uVar1;
                  auVar76._12_4_ = uVar1;
                  auVar76._16_4_ = uVar1;
                  auVar76._20_4_ = uVar1;
                  auVar76._24_4_ = uVar1;
                  auVar76._28_4_ = uVar1;
                  uVar1 = puVar19[2];
                  auVar84._4_4_ = uVar1;
                  auVar84._0_4_ = uVar1;
                  auVar84._8_4_ = uVar1;
                  auVar84._12_4_ = uVar1;
                  auVar84._16_4_ = uVar1;
                  auVar84._20_4_ = uVar1;
                  auVar84._24_4_ = uVar1;
                  auVar84._28_4_ = uVar1;
                  uVar1 = puVar19[3];
                  auVar88._4_4_ = uVar1;
                  auVar88._0_4_ = uVar1;
                  auVar88._8_4_ = uVar1;
                  auVar88._12_4_ = uVar1;
                  auVar88._16_4_ = uVar1;
                  auVar88._20_4_ = uVar1;
                  auVar88._24_4_ = uVar1;
                  auVar88._28_4_ = uVar1;
                  uVar1 = puVar19[4];
                  auVar97._4_4_ = uVar1;
                  auVar97._0_4_ = uVar1;
                  auVar97._8_4_ = uVar1;
                  auVar97._12_4_ = uVar1;
                  auVar97._16_4_ = uVar1;
                  auVar97._20_4_ = uVar1;
                  auVar97._24_4_ = uVar1;
                  auVar97._28_4_ = uVar1;
                  uVar1 = puVar19[5];
                  auVar101._4_4_ = uVar1;
                  auVar101._0_4_ = uVar1;
                  auVar101._8_4_ = uVar1;
                  auVar101._12_4_ = uVar1;
                  auVar101._16_4_ = uVar1;
                  auVar101._20_4_ = uVar1;
                  auVar101._24_4_ = uVar1;
                  auVar101._28_4_ = uVar1;
                  uVar1 = puVar19[6];
                  auVar102._4_4_ = uVar1;
                  auVar102._0_4_ = uVar1;
                  auVar102._8_4_ = uVar1;
                  auVar102._12_4_ = uVar1;
                  auVar102._16_4_ = uVar1;
                  auVar102._20_4_ = uVar1;
                  auVar102._24_4_ = uVar1;
                  auVar102._28_4_ = uVar1;
                  local_58._4_4_ = puVar19[7];
                  local_58._0_4_ = local_58._4_4_;
                  local_58._8_4_ = local_58._4_4_;
                  local_58._12_4_ = local_58._4_4_;
                  local_58._16_4_ = local_58._4_4_;
                  local_58._20_4_ = local_58._4_4_;
                  local_58._24_4_ = local_58._4_4_;
                  local_58._28_4_ = local_58._4_4_;
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar39,auVar56);
                  auVar24 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21 + 0x200);
                  auVar36 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21 + 0x220);
                  auVar37 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21 + 0x240);
                  auVar38 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21 + 0x260);
                  auVar7 = vfmadd213ps_fma(auVar25,auVar24,ZEXT1632(auVar8));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar36,auVar76);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar37,auVar84);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar38,auVar88);
                  auVar25 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21 + 0x280);
                  auVar29 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21 + 0x2a0);
                  auVar33 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21 + 0x2c0);
                  auVar39 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21 + 0x2e0);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar25,auVar97);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar29,auVar101);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar33,auVar102);
                  uVar1 = puVar19[8];
                  auVar89._4_4_ = uVar1;
                  auVar89._0_4_ = uVar1;
                  auVar89._8_4_ = uVar1;
                  auVar89._12_4_ = uVar1;
                  auVar89._16_4_ = uVar1;
                  auVar89._20_4_ = uVar1;
                  auVar89._24_4_ = uVar1;
                  auVar89._28_4_ = uVar1;
                  uVar1 = puVar19[9];
                  auVar85._4_4_ = uVar1;
                  auVar85._0_4_ = uVar1;
                  auVar85._8_4_ = uVar1;
                  auVar85._12_4_ = uVar1;
                  auVar85._16_4_ = uVar1;
                  auVar85._20_4_ = uVar1;
                  auVar85._24_4_ = uVar1;
                  auVar85._28_4_ = uVar1;
                  uVar1 = puVar19[10];
                  auVar77._4_4_ = uVar1;
                  auVar77._0_4_ = uVar1;
                  auVar77._8_4_ = uVar1;
                  auVar77._12_4_ = uVar1;
                  auVar77._16_4_ = uVar1;
                  auVar77._20_4_ = uVar1;
                  auVar77._24_4_ = uVar1;
                  auVar77._28_4_ = uVar1;
                  uVar1 = puVar19[0xb];
                  auVar98._4_4_ = uVar1;
                  auVar98._0_4_ = uVar1;
                  auVar98._8_4_ = uVar1;
                  auVar98._12_4_ = uVar1;
                  auVar98._16_4_ = uVar1;
                  auVar98._20_4_ = uVar1;
                  auVar98._24_4_ = uVar1;
                  auVar98._28_4_ = uVar1;
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar39,local_58);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar89,auVar24);
                  uVar1 = puVar19[0xc];
                  auVar57._4_4_ = uVar1;
                  auVar57._0_4_ = uVar1;
                  auVar57._8_4_ = uVar1;
                  auVar57._12_4_ = uVar1;
                  auVar57._16_4_ = uVar1;
                  auVar57._20_4_ = uVar1;
                  auVar57._24_4_ = uVar1;
                  auVar57._28_4_ = uVar1;
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar85,auVar36);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar77,auVar37);
                  uVar1 = puVar19[0xd];
                  auVar62._4_4_ = uVar1;
                  auVar62._0_4_ = uVar1;
                  auVar62._8_4_ = uVar1;
                  auVar62._12_4_ = uVar1;
                  auVar62._16_4_ = uVar1;
                  auVar62._20_4_ = uVar1;
                  auVar62._24_4_ = uVar1;
                  auVar62._28_4_ = uVar1;
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar98,auVar38);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar57,auVar25);
                  uVar1 = puVar19[0xe];
                  auVar70._4_4_ = uVar1;
                  auVar70._0_4_ = uVar1;
                  auVar70._8_4_ = uVar1;
                  auVar70._12_4_ = uVar1;
                  auVar70._16_4_ = uVar1;
                  auVar70._20_4_ = uVar1;
                  auVar70._24_4_ = uVar1;
                  auVar70._28_4_ = uVar1;
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar62,auVar29);
                  uVar1 = puVar19[0xf];
                  auVar48._4_4_ = uVar1;
                  auVar48._0_4_ = uVar1;
                  auVar48._8_4_ = uVar1;
                  auVar48._12_4_ = uVar1;
                  auVar48._16_4_ = uVar1;
                  auVar48._20_4_ = uVar1;
                  auVar48._24_4_ = uVar1;
                  auVar48._28_4_ = uVar1;
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar70,auVar33);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar48,auVar39);
                  auVar24 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21 + 0x300);
                  uVar1 = puVar19[0x10];
                  auVar91._4_4_ = uVar1;
                  auVar91._0_4_ = uVar1;
                  auVar91._8_4_ = uVar1;
                  auVar91._12_4_ = uVar1;
                  auVar91._16_4_ = uVar1;
                  auVar91._20_4_ = uVar1;
                  auVar91._24_4_ = uVar1;
                  auVar91._28_4_ = uVar1;
                  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar24,auVar89);
                  auVar7 = vfmadd213ps_fma(auVar91,auVar24,ZEXT1632(auVar8));
                  auVar24 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21 + 800);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar24,auVar85);
                  uVar1 = puVar19[0x11];
                  auVar36._4_4_ = uVar1;
                  auVar36._0_4_ = uVar1;
                  auVar36._8_4_ = uVar1;
                  auVar36._12_4_ = uVar1;
                  auVar36._16_4_ = uVar1;
                  auVar36._20_4_ = uVar1;
                  auVar36._24_4_ = uVar1;
                  auVar36._28_4_ = uVar1;
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar24,auVar36);
                  auVar24 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21 + 0x340);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar24,auVar77);
                  uVar1 = puVar19[0x12];
                  auVar37._4_4_ = uVar1;
                  auVar37._0_4_ = uVar1;
                  auVar37._8_4_ = uVar1;
                  auVar37._12_4_ = uVar1;
                  auVar37._16_4_ = uVar1;
                  auVar37._20_4_ = uVar1;
                  auVar37._24_4_ = uVar1;
                  auVar37._28_4_ = uVar1;
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar24,auVar37);
                  auVar24 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21 + 0x360);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar24,auVar98);
                  uVar1 = puVar19[0x13];
                  auVar38._4_4_ = uVar1;
                  auVar38._0_4_ = uVar1;
                  auVar38._8_4_ = uVar1;
                  auVar38._12_4_ = uVar1;
                  auVar38._16_4_ = uVar1;
                  auVar38._20_4_ = uVar1;
                  auVar38._24_4_ = uVar1;
                  auVar38._28_4_ = uVar1;
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar24,auVar38);
                  auVar24 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21 + 0x380);
                  uVar1 = puVar19[0x14];
                  auVar39._4_4_ = uVar1;
                  auVar39._0_4_ = uVar1;
                  auVar39._8_4_ = uVar1;
                  auVar39._12_4_ = uVar1;
                  auVar39._16_4_ = uVar1;
                  auVar39._20_4_ = uVar1;
                  auVar39._24_4_ = uVar1;
                  auVar39._28_4_ = uVar1;
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar24,auVar57);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar24,auVar39);
                  auVar24 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21 + 0x3a0);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar24,auVar62);
                  uVar1 = puVar19[0x15];
                  auVar40._4_4_ = uVar1;
                  auVar40._0_4_ = uVar1;
                  auVar40._8_4_ = uVar1;
                  auVar40._12_4_ = uVar1;
                  auVar40._16_4_ = uVar1;
                  auVar40._20_4_ = uVar1;
                  auVar40._24_4_ = uVar1;
                  auVar40._28_4_ = uVar1;
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar24,auVar40);
                  auVar24 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21 + 0x3c0);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar24,auVar70);
                  uVar1 = puVar19[0x16];
                  auVar41._4_4_ = uVar1;
                  auVar41._0_4_ = uVar1;
                  auVar41._8_4_ = uVar1;
                  auVar41._12_4_ = uVar1;
                  auVar41._16_4_ = uVar1;
                  auVar41._20_4_ = uVar1;
                  auVar41._24_4_ = uVar1;
                  auVar41._28_4_ = uVar1;
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar24,auVar41);
                  auVar24 = *(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21 + 0x3e0);
                  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar24,auVar48);
                  uVar1 = puVar19[0x17];
                  auVar42._4_4_ = uVar1;
                  auVar42._0_4_ = uVar1;
                  auVar42._8_4_ = uVar1;
                  auVar42._12_4_ = uVar1;
                  auVar42._16_4_ = uVar1;
                  auVar42._20_4_ = uVar1;
                  auVar42._24_4_ = uVar1;
                  auVar42._28_4_ = uVar1;
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar24,auVar42);
                  *pauVar14 = ZEXT1632(auVar8);
                  pauVar14[1] = ZEXT1632(auVar7);
                  puVar15 = puVar15 + 0x10;
                  puVar19 = puVar19 + 0x10;
                  pauVar14 = pauVar14 + 2;
                  iVar17 = iVar17 + 2;
                  uVar20 = uVar3 & 0xfffffffe;
                } while (iVar17 < (int)uVar3);
              }
              iVar17 = uVar3 - uVar20;
              puVar16 = puVar15;
              if (iVar17 != 0 && (int)uVar20 <= (int)uVar3) {
                do {
                  uVar1 = *puVar16;
                  auVar26._4_4_ = uVar1;
                  auVar26._0_4_ = uVar1;
                  auVar26._8_4_ = uVar1;
                  auVar26._12_4_ = uVar1;
                  auVar26._16_4_ = uVar1;
                  auVar26._20_4_ = uVar1;
                  auVar26._24_4_ = uVar1;
                  auVar26._28_4_ = uVar1;
                  uVar1 = puVar16[1];
                  auVar30._4_4_ = uVar1;
                  auVar30._0_4_ = uVar1;
                  auVar30._8_4_ = uVar1;
                  auVar30._12_4_ = uVar1;
                  auVar30._16_4_ = uVar1;
                  auVar30._20_4_ = uVar1;
                  auVar30._24_4_ = uVar1;
                  auVar30._28_4_ = uVar1;
                  uVar1 = puVar16[2];
                  auVar43._4_4_ = uVar1;
                  auVar43._0_4_ = uVar1;
                  auVar43._8_4_ = uVar1;
                  auVar43._12_4_ = uVar1;
                  auVar43._16_4_ = uVar1;
                  auVar43._20_4_ = uVar1;
                  auVar43._24_4_ = uVar1;
                  auVar43._28_4_ = uVar1;
                  uVar1 = puVar16[3];
                  auVar49._4_4_ = uVar1;
                  auVar49._0_4_ = uVar1;
                  auVar49._8_4_ = uVar1;
                  auVar49._12_4_ = uVar1;
                  auVar49._16_4_ = uVar1;
                  auVar49._20_4_ = uVar1;
                  auVar49._24_4_ = uVar1;
                  auVar49._28_4_ = uVar1;
                  uVar1 = puVar16[4];
                  auVar58._4_4_ = uVar1;
                  auVar58._0_4_ = uVar1;
                  auVar58._8_4_ = uVar1;
                  auVar58._12_4_ = uVar1;
                  auVar58._16_4_ = uVar1;
                  auVar58._20_4_ = uVar1;
                  auVar58._24_4_ = uVar1;
                  auVar58._28_4_ = uVar1;
                  uVar1 = puVar16[5];
                  auVar63._4_4_ = uVar1;
                  auVar63._0_4_ = uVar1;
                  auVar63._8_4_ = uVar1;
                  auVar63._12_4_ = uVar1;
                  auVar63._16_4_ = uVar1;
                  auVar63._20_4_ = uVar1;
                  auVar63._24_4_ = uVar1;
                  auVar63._28_4_ = uVar1;
                  uVar1 = puVar16[6];
                  auVar71._4_4_ = uVar1;
                  auVar71._0_4_ = uVar1;
                  auVar71._8_4_ = uVar1;
                  auVar71._12_4_ = uVar1;
                  auVar71._16_4_ = uVar1;
                  auVar71._20_4_ = uVar1;
                  auVar71._24_4_ = uVar1;
                  auVar71._28_4_ = uVar1;
                  uVar1 = puVar16[7];
                  auVar78._4_4_ = uVar1;
                  auVar78._0_4_ = uVar1;
                  auVar78._8_4_ = uVar1;
                  auVar78._12_4_ = uVar1;
                  auVar78._16_4_ = uVar1;
                  auVar78._20_4_ = uVar1;
                  auVar78._24_4_ = uVar1;
                  auVar78._28_4_ = uVar1;
                  auVar7 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)pvVar6 + lVar23 + lVar21),
                                           auVar26,*pauVar14);
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar30,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar23 + lVar21 + 0x20));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar43,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar23 + lVar21 + 0x40));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar49,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar23 + lVar21 + 0x60));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar58,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar23 + lVar21 + 0x80));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar63,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar23 + lVar21 + 0xa0));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar71,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar23 + lVar21 + 0xc0));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar78,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar23 + lVar21 + 0xe0));
                  puVar15 = puVar16 + 8;
                  uVar1 = puVar16[8];
                  auVar31._4_4_ = uVar1;
                  auVar31._0_4_ = uVar1;
                  auVar31._8_4_ = uVar1;
                  auVar31._12_4_ = uVar1;
                  auVar31._16_4_ = uVar1;
                  auVar31._20_4_ = uVar1;
                  auVar31._24_4_ = uVar1;
                  auVar31._28_4_ = uVar1;
                  uVar1 = puVar16[9];
                  auVar27._4_4_ = uVar1;
                  auVar27._0_4_ = uVar1;
                  auVar27._8_4_ = uVar1;
                  auVar27._12_4_ = uVar1;
                  auVar27._16_4_ = uVar1;
                  auVar27._20_4_ = uVar1;
                  auVar27._24_4_ = uVar1;
                  auVar27._28_4_ = uVar1;
                  uVar1 = puVar16[10];
                  auVar44._4_4_ = uVar1;
                  auVar44._0_4_ = uVar1;
                  auVar44._8_4_ = uVar1;
                  auVar44._12_4_ = uVar1;
                  auVar44._16_4_ = uVar1;
                  auVar44._20_4_ = uVar1;
                  auVar44._24_4_ = uVar1;
                  auVar44._28_4_ = uVar1;
                  uVar1 = puVar16[0xb];
                  auVar50._4_4_ = uVar1;
                  auVar50._0_4_ = uVar1;
                  auVar50._8_4_ = uVar1;
                  auVar50._12_4_ = uVar1;
                  auVar50._16_4_ = uVar1;
                  auVar50._20_4_ = uVar1;
                  auVar50._24_4_ = uVar1;
                  auVar50._28_4_ = uVar1;
                  uVar1 = puVar16[0xc];
                  auVar59._4_4_ = uVar1;
                  auVar59._0_4_ = uVar1;
                  auVar59._8_4_ = uVar1;
                  auVar59._12_4_ = uVar1;
                  auVar59._16_4_ = uVar1;
                  auVar59._20_4_ = uVar1;
                  auVar59._24_4_ = uVar1;
                  auVar59._28_4_ = uVar1;
                  uVar1 = puVar16[0xd];
                  auVar64._4_4_ = uVar1;
                  auVar64._0_4_ = uVar1;
                  auVar64._8_4_ = uVar1;
                  auVar64._12_4_ = uVar1;
                  auVar64._16_4_ = uVar1;
                  auVar64._20_4_ = uVar1;
                  auVar64._24_4_ = uVar1;
                  auVar64._28_4_ = uVar1;
                  uVar1 = puVar16[0xe];
                  auVar72._4_4_ = uVar1;
                  auVar72._0_4_ = uVar1;
                  auVar72._8_4_ = uVar1;
                  auVar72._12_4_ = uVar1;
                  auVar72._16_4_ = uVar1;
                  auVar72._20_4_ = uVar1;
                  auVar72._24_4_ = uVar1;
                  auVar72._28_4_ = uVar1;
                  uVar1 = puVar16[0xf];
                  auVar79._4_4_ = uVar1;
                  auVar79._0_4_ = uVar1;
                  auVar79._8_4_ = uVar1;
                  auVar79._12_4_ = uVar1;
                  auVar79._16_4_ = uVar1;
                  auVar79._20_4_ = uVar1;
                  auVar79._24_4_ = uVar1;
                  auVar79._28_4_ = uVar1;
                  auVar7 = vfmadd132ps_fma(auVar31,ZEXT1632(auVar7),
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar23 + lVar21 + 0x100));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar27,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar23 + lVar21 + 0x120));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar44,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar23 + lVar21 + 0x140));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar50,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar23 + lVar21 + 0x160));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar59,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar23 + lVar21 + 0x180));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar64,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar23 + lVar21 + 0x1a0));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar72,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar23 + lVar21 + 0x1c0));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar79,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar23 + lVar21 + 0x1e0));
                  uVar1 = *puVar19;
                  auVar28._4_4_ = uVar1;
                  auVar28._0_4_ = uVar1;
                  auVar28._8_4_ = uVar1;
                  auVar28._12_4_ = uVar1;
                  auVar28._16_4_ = uVar1;
                  auVar28._20_4_ = uVar1;
                  auVar28._24_4_ = uVar1;
                  auVar28._28_4_ = uVar1;
                  uVar1 = puVar19[1];
                  auVar45._4_4_ = uVar1;
                  auVar45._0_4_ = uVar1;
                  auVar45._8_4_ = uVar1;
                  auVar45._12_4_ = uVar1;
                  auVar45._16_4_ = uVar1;
                  auVar45._20_4_ = uVar1;
                  auVar45._24_4_ = uVar1;
                  auVar45._28_4_ = uVar1;
                  uVar1 = puVar19[2];
                  auVar51._4_4_ = uVar1;
                  auVar51._0_4_ = uVar1;
                  auVar51._8_4_ = uVar1;
                  auVar51._12_4_ = uVar1;
                  auVar51._16_4_ = uVar1;
                  auVar51._20_4_ = uVar1;
                  auVar51._24_4_ = uVar1;
                  auVar51._28_4_ = uVar1;
                  uVar1 = puVar19[3];
                  auVar60._4_4_ = uVar1;
                  auVar60._0_4_ = uVar1;
                  auVar60._8_4_ = uVar1;
                  auVar60._12_4_ = uVar1;
                  auVar60._16_4_ = uVar1;
                  auVar60._20_4_ = uVar1;
                  auVar60._24_4_ = uVar1;
                  auVar60._28_4_ = uVar1;
                  uVar1 = puVar19[4];
                  auVar65._4_4_ = uVar1;
                  auVar65._0_4_ = uVar1;
                  auVar65._8_4_ = uVar1;
                  auVar65._12_4_ = uVar1;
                  auVar65._16_4_ = uVar1;
                  auVar65._20_4_ = uVar1;
                  auVar65._24_4_ = uVar1;
                  auVar65._28_4_ = uVar1;
                  uVar1 = puVar19[5];
                  auVar73._4_4_ = uVar1;
                  auVar73._0_4_ = uVar1;
                  auVar73._8_4_ = uVar1;
                  auVar73._12_4_ = uVar1;
                  auVar73._16_4_ = uVar1;
                  auVar73._20_4_ = uVar1;
                  auVar73._24_4_ = uVar1;
                  auVar73._28_4_ = uVar1;
                  uVar1 = puVar19[6];
                  auVar80._4_4_ = uVar1;
                  auVar80._0_4_ = uVar1;
                  auVar80._8_4_ = uVar1;
                  auVar80._12_4_ = uVar1;
                  auVar80._16_4_ = uVar1;
                  auVar80._20_4_ = uVar1;
                  auVar80._24_4_ = uVar1;
                  auVar80._28_4_ = uVar1;
                  uVar1 = puVar19[7];
                  auVar86._4_4_ = uVar1;
                  auVar86._0_4_ = uVar1;
                  auVar86._8_4_ = uVar1;
                  auVar86._12_4_ = uVar1;
                  auVar86._16_4_ = uVar1;
                  auVar86._20_4_ = uVar1;
                  auVar86._24_4_ = uVar1;
                  auVar86._28_4_ = uVar1;
                  auVar7 = vfmadd132ps_fma(auVar28,ZEXT1632(auVar7),
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar23 + lVar21 + 0x200));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar45,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar23 + lVar21 + 0x220));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar51,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar23 + lVar21 + 0x240));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar60,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar23 + lVar21 + 0x260));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar65,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar23 + lVar21 + 0x280));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar73,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar23 + lVar21 + 0x2a0));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar80,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar23 + lVar21 + 0x2c0));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar86,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar23 + lVar21 + 0x2e0));
                  uVar1 = puVar19[8];
                  auVar32._4_4_ = uVar1;
                  auVar32._0_4_ = uVar1;
                  auVar32._8_4_ = uVar1;
                  auVar32._12_4_ = uVar1;
                  auVar32._16_4_ = uVar1;
                  auVar32._20_4_ = uVar1;
                  auVar32._24_4_ = uVar1;
                  auVar32._28_4_ = uVar1;
                  uVar1 = puVar19[9];
                  auVar46._4_4_ = uVar1;
                  auVar46._0_4_ = uVar1;
                  auVar46._8_4_ = uVar1;
                  auVar46._12_4_ = uVar1;
                  auVar46._16_4_ = uVar1;
                  auVar46._20_4_ = uVar1;
                  auVar46._24_4_ = uVar1;
                  auVar46._28_4_ = uVar1;
                  uVar1 = puVar19[10];
                  auVar52._4_4_ = uVar1;
                  auVar52._0_4_ = uVar1;
                  auVar52._8_4_ = uVar1;
                  auVar52._12_4_ = uVar1;
                  auVar52._16_4_ = uVar1;
                  auVar52._20_4_ = uVar1;
                  auVar52._24_4_ = uVar1;
                  auVar52._28_4_ = uVar1;
                  uVar1 = puVar19[0xb];
                  auVar61._4_4_ = uVar1;
                  auVar61._0_4_ = uVar1;
                  auVar61._8_4_ = uVar1;
                  auVar61._12_4_ = uVar1;
                  auVar61._16_4_ = uVar1;
                  auVar61._20_4_ = uVar1;
                  auVar61._24_4_ = uVar1;
                  auVar61._28_4_ = uVar1;
                  uVar1 = puVar19[0xc];
                  auVar66._4_4_ = uVar1;
                  auVar66._0_4_ = uVar1;
                  auVar66._8_4_ = uVar1;
                  auVar66._12_4_ = uVar1;
                  auVar66._16_4_ = uVar1;
                  auVar66._20_4_ = uVar1;
                  auVar66._24_4_ = uVar1;
                  auVar66._28_4_ = uVar1;
                  uVar1 = puVar19[0xd];
                  auVar74._4_4_ = uVar1;
                  auVar74._0_4_ = uVar1;
                  auVar74._8_4_ = uVar1;
                  auVar74._12_4_ = uVar1;
                  auVar74._16_4_ = uVar1;
                  auVar74._20_4_ = uVar1;
                  auVar74._24_4_ = uVar1;
                  auVar74._28_4_ = uVar1;
                  uVar1 = puVar19[0xe];
                  auVar81._4_4_ = uVar1;
                  auVar81._0_4_ = uVar1;
                  auVar81._8_4_ = uVar1;
                  auVar81._12_4_ = uVar1;
                  auVar81._16_4_ = uVar1;
                  auVar81._20_4_ = uVar1;
                  auVar81._24_4_ = uVar1;
                  auVar81._28_4_ = uVar1;
                  uVar1 = puVar19[0xf];
                  auVar87._4_4_ = uVar1;
                  auVar87._0_4_ = uVar1;
                  auVar87._8_4_ = uVar1;
                  auVar87._12_4_ = uVar1;
                  auVar87._16_4_ = uVar1;
                  auVar87._20_4_ = uVar1;
                  auVar87._24_4_ = uVar1;
                  auVar87._28_4_ = uVar1;
                  auVar7 = vfmadd132ps_fma(auVar32,ZEXT1632(auVar7),
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar23 + lVar21 + 0x300));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar46,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar23 + lVar21 + 800));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar52,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar23 + lVar21 + 0x340));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar61,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar23 + lVar21 + 0x360));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar66,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar23 + lVar21 + 0x380));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar74,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar23 + lVar21 + 0x3a0));
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar81,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar23 + lVar21 + 0x3c0));
                  puVar19 = puVar19 + 8;
                  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar87,
                                           *(undefined1 (*) [32])
                                            ((long)pvVar6 + lVar23 + lVar21 + 0x3e0));
                  *pauVar14 = ZEXT1632(auVar7);
                  pauVar14 = pauVar14 + 1;
                  iVar17 = iVar17 + -1;
                  puVar16 = puVar15;
                } while (iVar17 != 0);
              }
              puVar15 = puVar15 + 8;
              puVar19 = puVar19 + 8;
              iVar10 = iVar10 + 1;
            } while (iVar10 != iVar4);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar5);
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != iVar2);
  }
  return;
}

Assistant:

static void conv2x2s1_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + p * 8) : _mm256_set1_ps(0.f);
        out0.fill(_bias0);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0.row(0);

            const Mat img0 = bottom_blob.channel(q);

            const float* r0 = img0.row(0);
            const float* r1 = img0.row(1);

            const float* kptr = (const float*)kernel.channel(p).row(q);
            // const float* kptr = (const float*)kernel + 4 * inch * p * 64;

            int i = 0;
            for (; i < outh; i++)
            {
                int j = 0;

                for (; j + 1 < outw; j += 2)
                {
                    __m256 _sum0 = _mm256_loadu_ps(outptr0);
                    __m256 _sum1 = _mm256_loadu_ps(outptr0 + 8);

                    __m256 _r00 = _mm256_broadcast_ss(r0);
                    __m256 _r01 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r04 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _r05 = _mm256_broadcast_ss(r0 + 5);
                    __m256 _r06 = _mm256_broadcast_ss(r0 + 6);
                    __m256 _r07 = _mm256_broadcast_ss(r0 + 7);
                    r0 += 8;

                    __m256 _k00 = _mm256_loadu_ps(kptr);
                    __m256 _k01 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k02 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k03 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k03, _r03, _sum0);

                    __m256 _k04 = _mm256_loadu_ps(kptr);
                    __m256 _k05 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k06 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k07 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k04, _r04, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k05, _r05, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k06, _r06, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k07, _r07, _sum0);

                    //========================================

                    _r00 = _mm256_broadcast_ss(r0);
                    _r01 = _mm256_broadcast_ss(r0 + 1);
                    _r02 = _mm256_broadcast_ss(r0 + 2);
                    _r03 = _mm256_broadcast_ss(r0 + 3);
                    _r04 = _mm256_broadcast_ss(r0 + 4);
                    _r05 = _mm256_broadcast_ss(r0 + 5);
                    _r06 = _mm256_broadcast_ss(r0 + 6);
                    _r07 = _mm256_broadcast_ss(r0 + 7);
                    r0 += 8;

                    _sum1 = _mm256_comp_fmadd_ps(_k00, _r00, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k01, _r01, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k02, _r02, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k03, _r03, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k04, _r04, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k05, _r05, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k06, _r06, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k07, _r07, _sum1);

                    _k00 = _mm256_loadu_ps(kptr);
                    _k01 = _mm256_loadu_ps(kptr + 8);
                    _k02 = _mm256_loadu_ps(kptr + 16);
                    _k03 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k03, _r03, _sum0);

                    _k04 = _mm256_loadu_ps(kptr);
                    _k05 = _mm256_loadu_ps(kptr + 8);
                    _k06 = _mm256_loadu_ps(kptr + 16);
                    _k07 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k04, _r04, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k05, _r05, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k06, _r06, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k07, _r07, _sum0);

                    _r00 = _mm256_broadcast_ss(r0);
                    _r01 = _mm256_broadcast_ss(r0 + 1);
                    _r02 = _mm256_broadcast_ss(r0 + 2);
                    _r03 = _mm256_broadcast_ss(r0 + 3);
                    _r04 = _mm256_broadcast_ss(r0 + 4);
                    _r05 = _mm256_broadcast_ss(r0 + 5);
                    _r06 = _mm256_broadcast_ss(r0 + 6);
                    _r07 = _mm256_broadcast_ss(r0 + 7);

                    _sum1 = _mm256_comp_fmadd_ps(_k00, _r00, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k01, _r01, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k02, _r02, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k03, _r03, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k04, _r04, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k05, _r05, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k06, _r06, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k07, _r07, _sum1);
                    //===============

                    __m256 _r10 = _mm256_broadcast_ss(r1);
                    __m256 _r11 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 4);
                    __m256 _r15 = _mm256_broadcast_ss(r1 + 5);
                    __m256 _r16 = _mm256_broadcast_ss(r1 + 6);
                    __m256 _r17 = _mm256_broadcast_ss(r1 + 7);

                    __m256 _k10 = _mm256_loadu_ps(kptr);
                    __m256 _k11 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k12 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k13 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k13, _r13, _sum0);

                    __m256 _k14 = _mm256_loadu_ps(kptr);
                    __m256 _k15 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k16 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k17 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k14, _r14, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k15, _r15, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k16, _r16, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k17, _r17, _sum0);

                    //=======================================
                    r1 += 8;
                    _r10 = _mm256_broadcast_ss(r1);
                    _r11 = _mm256_broadcast_ss(r1 + 1);
                    _r12 = _mm256_broadcast_ss(r1 + 2);
                    _r13 = _mm256_broadcast_ss(r1 + 3);
                    _r14 = _mm256_broadcast_ss(r1 + 4);
                    _r15 = _mm256_broadcast_ss(r1 + 5);
                    _r16 = _mm256_broadcast_ss(r1 + 6);
                    _r17 = _mm256_broadcast_ss(r1 + 7);

                    _sum1 = _mm256_comp_fmadd_ps(_k10, _r10, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k11, _r11, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k12, _r12, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k13, _r13, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k14, _r14, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k15, _r15, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k16, _r16, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k17, _r17, _sum1);

                    _k10 = _mm256_loadu_ps(kptr);
                    _k11 = _mm256_loadu_ps(kptr + 8);
                    _k12 = _mm256_loadu_ps(kptr + 16);
                    _k13 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k13, _r13, _sum0);

                    _k14 = _mm256_loadu_ps(kptr);
                    _k15 = _mm256_loadu_ps(kptr + 8);
                    _k16 = _mm256_loadu_ps(kptr + 16);
                    _k17 = _mm256_loadu_ps(kptr + 24);
                    _sum0 = _mm256_comp_fmadd_ps(_k14, _r14, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k15, _r15, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k16, _r16, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k17, _r17, _sum0);

                    r1 += 8;
                    _r10 = _mm256_broadcast_ss(r1);
                    _r11 = _mm256_broadcast_ss(r1 + 1);
                    _r12 = _mm256_broadcast_ss(r1 + 2);
                    _r13 = _mm256_broadcast_ss(r1 + 3);
                    _r14 = _mm256_broadcast_ss(r1 + 4);
                    _r15 = _mm256_broadcast_ss(r1 + 5);
                    _r16 = _mm256_broadcast_ss(r1 + 6);
                    _r17 = _mm256_broadcast_ss(r1 + 7);

                    _sum1 = _mm256_comp_fmadd_ps(_k10, _r10, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k11, _r11, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k12, _r12, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k13, _r13, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k14, _r14, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k15, _r15, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k16, _r16, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k17, _r17, _sum1);

                    kptr -= 224;
                    _mm256_storeu_ps(outptr0, _sum0);
                    _mm256_storeu_ps(outptr0 + 8, _sum1);
                    outptr0 += 16;
                }

                for (; j < outw; j++)
                {
                    __m256 _sum = _mm256_loadu_ps(outptr0);

                    __m256 _r00 = _mm256_broadcast_ss(r0);
                    __m256 _r01 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r04 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _r05 = _mm256_broadcast_ss(r0 + 5);
                    __m256 _r06 = _mm256_broadcast_ss(r0 + 6);
                    __m256 _r07 = _mm256_broadcast_ss(r0 + 7);

                    __m256 _k00 = _mm256_loadu_ps(kptr);
                    __m256 _k01 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k02 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k03 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k00, _r00, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k01, _r01, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k02, _r02, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k03, _r03, _sum);

                    __m256 _k04 = _mm256_loadu_ps(kptr);
                    __m256 _k05 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k06 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k07 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k04, _r04, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k05, _r05, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k06, _r06, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k07, _r07, _sum);

                    //========================================
                    r0 += 8;
                    _r00 = _mm256_broadcast_ss(r0);
                    _r01 = _mm256_broadcast_ss(r0 + 1);
                    _r02 = _mm256_broadcast_ss(r0 + 2);
                    _r03 = _mm256_broadcast_ss(r0 + 3);
                    _r04 = _mm256_broadcast_ss(r0 + 4);
                    _r05 = _mm256_broadcast_ss(r0 + 5);
                    _r06 = _mm256_broadcast_ss(r0 + 6);
                    _r07 = _mm256_broadcast_ss(r0 + 7);

                    _k00 = _mm256_loadu_ps(kptr);
                    _k01 = _mm256_loadu_ps(kptr + 8);
                    _k02 = _mm256_loadu_ps(kptr + 16);
                    _k03 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k00, _r00, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k01, _r01, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k02, _r02, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k03, _r03, _sum);

                    _k04 = _mm256_loadu_ps(kptr);
                    _k05 = _mm256_loadu_ps(kptr + 8);
                    _k06 = _mm256_loadu_ps(kptr + 16);
                    _k07 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k04, _r04, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k05, _r05, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k06, _r06, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k07, _r07, _sum);
                    //===============

                    __m256 _r10 = _mm256_broadcast_ss(r1);
                    __m256 _r11 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 4);
                    __m256 _r15 = _mm256_broadcast_ss(r1 + 5);
                    __m256 _r16 = _mm256_broadcast_ss(r1 + 6);
                    __m256 _r17 = _mm256_broadcast_ss(r1 + 7);

                    __m256 _k10 = _mm256_loadu_ps(kptr);
                    __m256 _k11 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k12 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k13 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k10, _r10, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k11, _r11, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k12, _r12, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k13, _r13, _sum);

                    __m256 _k14 = _mm256_loadu_ps(kptr);
                    __m256 _k15 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k16 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k17 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k14, _r14, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k15, _r15, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k16, _r16, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k17, _r17, _sum);

                    //=======================================
                    r1 += 8;
                    _r10 = _mm256_broadcast_ss(r1);
                    _r11 = _mm256_broadcast_ss(r1 + 1);
                    _r12 = _mm256_broadcast_ss(r1 + 2);
                    _r13 = _mm256_broadcast_ss(r1 + 3);
                    _r14 = _mm256_broadcast_ss(r1 + 4);
                    _r15 = _mm256_broadcast_ss(r1 + 5);
                    _r16 = _mm256_broadcast_ss(r1 + 6);
                    _r17 = _mm256_broadcast_ss(r1 + 7);

                    _k10 = _mm256_loadu_ps(kptr);
                    _k11 = _mm256_loadu_ps(kptr + 8);
                    _k12 = _mm256_loadu_ps(kptr + 16);
                    _k13 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k10, _r10, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k11, _r11, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k12, _r12, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k13, _r13, _sum);

                    _k14 = _mm256_loadu_ps(kptr);
                    _k15 = _mm256_loadu_ps(kptr + 8);
                    _k16 = _mm256_loadu_ps(kptr + 16);
                    _k17 = _mm256_loadu_ps(kptr + 24);
                    _sum = _mm256_comp_fmadd_ps(_k14, _r14, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k15, _r15, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k16, _r16, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k17, _r17, _sum);

                    kptr -= 224;
                    _mm256_storeu_ps(outptr0, _sum);
                    outptr0 += 8;
                }

                r0 += 8;
                r1 += 8;
            }
        }
    }
}